

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_vector.hpp
# Opt level: O0

void __thiscall poplar::compact_vector::set(compact_vector *this,uint64_t i,uint64_t v)

{
  pointer puVar1;
  type_conflict tVar2;
  type_conflict *ptVar3;
  type_conflict *ptVar4;
  reference pvVar5;
  ulong uVar6;
  byte bVar7;
  ulong in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  uint64_t diff;
  type_conflict *mod;
  type_conflict *quo;
  uint64_t in_stack_ffffffffffffffa0;
  
  decompose_value<64ul>(in_stack_ffffffffffffffa0);
  ptVar3 = std::get<0ul,unsigned_long,unsigned_long>((pair<unsigned_long,_unsigned_long> *)0x198410)
  ;
  ptVar4 = std::get<1ul,unsigned_long,unsigned_long>((pair<unsigned_long,_unsigned_long> *)0x19841f)
  ;
  puVar1 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  tVar2 = *ptVar4;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI,*ptVar3);
  *pvVar5 = ((long)puVar1 << ((byte)tVar2 & 0x3f) ^ 0xffffffffffffffffU) & *pvVar5;
  puVar1 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  tVar2 = *ptVar4;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI,*ptVar3);
  *pvVar5 = (in_RDX & (ulong)puVar1) << ((byte)tVar2 & 0x3f) | *pvVar5;
  if (0x40 < *ptVar4 + (long)in_RDI[1].
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage) {
    bVar7 = 0x40 - (char)*ptVar4;
    puVar1 = in_RDI[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_RDI,*ptVar3 + 1);
    *pvVar5 = ((ulong)puVar1 >> (bVar7 & 0x3f) ^ 0xffffffffffffffff) & *pvVar5;
    uVar6 = (in_RDX & (ulong)in_RDI[1].
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish) >> (bVar7 & 0x3f);
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_RDI,*ptVar3 + 1);
    *pvVar5 = uVar6 | *pvVar5;
  }
  return;
}

Assistant:

void set(uint64_t i, uint64_t v) {
        assert(i < size_);
        assert(v <= mask_);

        auto [quo, mod] = decompose_value<64>(i * width_);

        chunks_[quo] &= ~(mask_ << mod);
        chunks_[quo] |= (v & mask_) << mod;

        if (64 < mod + width_) {
            const uint64_t diff = 64 - mod;
            chunks_[quo + 1] &= ~(mask_ >> diff);
            chunks_[quo + 1] |= (v & mask_) >> diff;
        }
    }